

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImFont::BuildLookupTable(ImFont *this)

{
  ImVector<ImFontGlyph> *this_00;
  ImVector<float> *this_01;
  ImVector<unsigned_short> *this_02;
  value_type vVar1;
  ushort uVar2;
  undefined2 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  value_type *pvVar10;
  value_type *pvVar11;
  value_type_conflict3 *pvVar12;
  ImFontGlyph *pIVar13;
  uint uVar14;
  int i_1;
  int iVar15;
  int i;
  uint i_00;
  int i_2;
  float fVar16;
  
  this_00 = &this->Glyphs;
  uVar14 = 0;
  for (i_00 = 0; i_00 != this_00->Size; i_00 = i_00 + 1) {
    pvVar10 = ImVector<ImFontGlyph>::operator[](this_00,i_00);
    if (uVar14 <= pvVar10->Codepoint) {
      uVar14 = (uint)pvVar10->Codepoint;
    }
  }
  if (i_00 < 0xffff) {
    this_01 = &this->IndexAdvanceX;
    ImVector<float>::clear(this_01);
    this_02 = &this->IndexLookup;
    ImVector<unsigned_short>::clear(this_02);
    this->DirtyLookupTables = false;
    GrowIndex(this,uVar14 + 1);
    for (iVar15 = 0; iVar15 < this_00->Size; iVar15 = iVar15 + 1) {
      pvVar10 = ImVector<ImFontGlyph>::operator[](this_00,iVar15);
      uVar2 = pvVar10->Codepoint;
      pvVar10 = ImVector<ImFontGlyph>::operator[](this_00,iVar15);
      fVar16 = pvVar10->AdvanceX;
      pvVar11 = ImVector<float>::operator[](this_01,(uint)uVar2);
      *pvVar11 = fVar16;
      pvVar12 = ImVector<unsigned_short>::operator[](this_02,(uint)uVar2);
      *pvVar12 = (value_type_conflict3)iVar15;
    }
    pIVar13 = FindGlyph(this,0x20);
    if (pIVar13 != (ImFontGlyph *)0x0) {
      pvVar10 = ImVector<ImFontGlyph>::back(this_00);
      if (pvVar10->Codepoint != 9) {
        ImVector<ImFontGlyph>::resize(this_00,this_00->Size + 1);
      }
      pvVar10 = ImVector<ImFontGlyph>::back(this_00);
      pIVar13 = FindGlyph(this,0x20);
      uVar3 = *(undefined2 *)&pIVar13->field_0x2;
      fVar16 = pIVar13->AdvanceX;
      fVar4 = pIVar13->X0;
      fVar5 = pIVar13->Y0;
      fVar6 = pIVar13->X1;
      fVar7 = pIVar13->Y1;
      fVar8 = pIVar13->U0;
      fVar9 = pIVar13->V0;
      pvVar10->Codepoint = pIVar13->Codepoint;
      *(undefined2 *)&pvVar10->field_0x2 = uVar3;
      pvVar10->AdvanceX = fVar16;
      pvVar10->X0 = fVar4;
      pvVar10->Y0 = fVar5;
      pvVar10->X1 = fVar6;
      pvVar10->Y1 = fVar7;
      pvVar10->U0 = fVar8;
      pvVar10->V0 = fVar9;
      fVar16 = pIVar13->V1;
      pvVar10->U1 = pIVar13->U1;
      pvVar10->V1 = fVar16;
      pvVar10->Codepoint = 9;
      fVar16 = pvVar10->AdvanceX * 4.0;
      pvVar10->AdvanceX = fVar16;
      pvVar11 = ImVector<float>::operator[](this_01,9);
      *pvVar11 = fVar16;
      iVar15 = (this->Glyphs).Size;
      pvVar12 = ImVector<unsigned_short>::operator[](this_02,(uint)pvVar10->Codepoint);
      *pvVar12 = (short)iVar15 - 1;
    }
    pIVar13 = FindGlyphNoFallback(this,this->FallbackChar);
    this->FallbackGlyph = pIVar13;
    fVar16 = 0.0;
    if (pIVar13 != (ImFontGlyph *)0x0) {
      fVar16 = pIVar13->AdvanceX;
    }
    this->FallbackAdvanceX = fVar16;
    for (iVar15 = 0; uVar14 + 1 != iVar15; iVar15 = iVar15 + 1) {
      pvVar11 = ImVector<float>::operator[](this_01,iVar15);
      if (*pvVar11 <= 0.0 && *pvVar11 != 0.0) {
        vVar1 = this->FallbackAdvanceX;
        pvVar11 = ImVector<float>::operator[](this_01,iVar15);
        *pvVar11 = vVar1;
      }
    }
    return;
  }
  __assert_fail("Glyphs.Size < 0xFFFF",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                ,0x8ad,"void ImFont::BuildLookupTable()");
}

Assistant:

void ImFont::BuildLookupTable()
{
    int max_codepoint = 0;
    for (int i = 0; i != Glyphs.Size; i++)
        max_codepoint = ImMax(max_codepoint, (int)Glyphs[i].Codepoint);

    IM_ASSERT(Glyphs.Size < 0xFFFF); // -1 is reserved
    IndexAdvanceX.clear();
    IndexLookup.clear();
    DirtyLookupTables = false;
    GrowIndex(max_codepoint + 1);
    for (int i = 0; i < Glyphs.Size; i++)
    {
        int codepoint = (int)Glyphs[i].Codepoint;
        IndexAdvanceX[codepoint] = Glyphs[i].AdvanceX;
        IndexLookup[codepoint] = (unsigned short)i;
    }

    // Create a glyph to handle TAB
    // FIXME: Needs proper TAB handling but it needs to be contextualized (or we could arbitrary say that each string starts at "column 0" ?)
    if (FindGlyph((unsigned short)' '))
    {
        if (Glyphs.back().Codepoint != '\t')   // So we can call this function multiple times
            Glyphs.resize(Glyphs.Size + 1);
        ImFontGlyph& tab_glyph = Glyphs.back();
        tab_glyph = *FindGlyph((unsigned short)' ');
        tab_glyph.Codepoint = '\t';
        tab_glyph.AdvanceX *= 4;
        IndexAdvanceX[(int)tab_glyph.Codepoint] = (float)tab_glyph.AdvanceX;
        IndexLookup[(int)tab_glyph.Codepoint] = (unsigned short)(Glyphs.Size-1);
    }

    FallbackGlyph = FindGlyphNoFallback(FallbackChar);
    FallbackAdvanceX = FallbackGlyph ? FallbackGlyph->AdvanceX : 0.0f;
    for (int i = 0; i < max_codepoint + 1; i++)
        if (IndexAdvanceX[i] < 0.0f)
            IndexAdvanceX[i] = FallbackAdvanceX;
}